

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O3

EGLConfig eglu::chooseSingleConfig(Library *egl,EGLDisplay display,EGLint *attribList)

{
  EGLConfig pvVar1;
  NotSupportedError *this;
  vector<void_*,_std::allocator<void_*>_> configs;
  vector<void_*,_std::allocator<void_*>_> local_28;
  
  chooseConfigs(&local_28,egl,display,attribList);
  if (local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pvVar1 = *local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    operator_delete(local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return pvVar1;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"No matching EGL config found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0xa0);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

EGLConfig chooseSingleConfig (const Library& egl, EGLDisplay display, const EGLint* attribList)
{
	const vector<EGLConfig> configs (chooseConfigs(egl, display, attribList));
	if (configs.empty())
		TCU_THROW(NotSupportedError, "No matching EGL config found");

	return configs.front();
}